

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O2

Vec_Ptr_t * Io_ReadBlifGetTokens(Io_ReadBlif_t *p)

{
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar1;
  size_t sVar2;
  char *pcVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  pVVar1 = p->vNewTokens;
  iVar5 = pVVar1->nSize;
  if (0 < iVar5) {
    for (lVar7 = 0; lVar7 < iVar5; lVar7 = lVar7 + 1) {
      if (pVVar1->pArray[lVar7] != (void *)0x0) {
        free(pVVar1->pArray[lVar7]);
        p->vNewTokens->pArray[lVar7] = (void *)0x0;
        pVVar1 = p->vNewTokens;
        iVar5 = pVVar1->nSize;
      }
    }
    pVVar1->nSize = 0;
  }
  pVVar1 = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p->pReader);
  if (pVVar1 == (Vec_Ptr_t *)0x0) {
    pVVar1 = (Vec_Ptr_t *)0x0;
  }
  else {
    pcVar3 = (char *)pVVar1->pArray[(long)pVVar1->nSize + -1];
    sVar2 = strlen(pcVar3);
    if (pcVar3[sVar2 - 1] == '\\') {
      pcVar3[sVar2 - 1] = '\0';
      if (*pcVar3 == '\0') {
        pVVar1->nSize = pVVar1->nSize + -1;
      }
      for (lVar7 = 0; lVar7 < pVVar1->nSize; lVar7 = lVar7 + 1) {
        p_00 = p->vNewTokens;
        pcVar3 = Extra_UtilStrsav((char *)pVVar1->pArray[lVar7]);
        Vec_PtrPush(p_00,pcVar3);
      }
      while( true ) {
        pvVar4 = Extra_FileReaderGetTokens(p->pReader);
        uVar6 = (ulong)*(int *)((long)pvVar4 + 4);
        if (uVar6 == 0) break;
        pcVar3 = *(char **)(*(long *)((long)pvVar4 + 8) + -8 + uVar6 * 8);
        sVar2 = strlen(pcVar3);
        if (pcVar3[sVar2 - 1] != '\\') {
          for (lVar7 = 0; pVVar1 = p->vNewTokens, lVar7 < (int)uVar6; lVar7 = lVar7 + 1) {
            pcVar3 = Extra_UtilStrsav(*(char **)(*(long *)((long)pvVar4 + 8) + lVar7 * 8));
            Vec_PtrPush(pVVar1,pcVar3);
            uVar6 = (ulong)*(uint *)((long)pvVar4 + 4);
          }
          return pVVar1;
        }
        pcVar3[sVar2 - 1] = '\0';
        if (*pcVar3 == '\0') {
          *(int *)((long)pvVar4 + 4) = *(int *)((long)pvVar4 + 4) + -1;
        }
        for (lVar7 = 0; lVar7 < *(int *)((long)pvVar4 + 4); lVar7 = lVar7 + 1) {
          pVVar1 = p->vNewTokens;
          pcVar3 = Extra_UtilStrsav(*(char **)(*(long *)((long)pvVar4 + 8) + lVar7 * 8));
          Vec_PtrPush(pVVar1,pcVar3);
        }
      }
      pVVar1 = p->vNewTokens;
    }
  }
  return pVVar1;
}

Assistant:

Vec_Ptr_t * Io_ReadBlifGetTokens( Io_ReadBlif_t * p )
{
    Vec_Ptr_t * vTokens;
    char * pLastToken;
    int i;

    // get rid of the old tokens
    if ( p->vNewTokens->nSize > 0 )
    {
        for ( i = 0; i < p->vNewTokens->nSize; i++ )
            ABC_FREE( p->vNewTokens->pArray[i] );
        p->vNewTokens->nSize = 0;
    }

    // get the new tokens
    vTokens = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p->pReader);
    if ( vTokens == NULL )
        return vTokens;

    // check if there is a transfer to another line
    pLastToken = (char *)vTokens->pArray[vTokens->nSize - 1];
    if ( pLastToken[ strlen(pLastToken)-1 ] != '\\' )
        return vTokens;

    // remove the slash
    pLastToken[ strlen(pLastToken)-1 ] = 0;
    if ( pLastToken[0] == 0 )
        vTokens->nSize--;
    // load them into the new array
    for ( i = 0; i < vTokens->nSize; i++ )
        Vec_PtrPush( p->vNewTokens, Extra_UtilStrsav((char *)vTokens->pArray[i]) );

    // load as long as there is the line break
    while ( 1 )
    {
        // get the new tokens
        vTokens = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p->pReader);
        if ( vTokens->nSize == 0 )
            return p->vNewTokens;
        // check if there is a transfer to another line
        pLastToken = (char *)vTokens->pArray[vTokens->nSize - 1];
        if ( pLastToken[ strlen(pLastToken)-1 ] == '\\' )
        {
            // remove the slash
            pLastToken[ strlen(pLastToken)-1 ] = 0;
            if ( pLastToken[0] == 0 )
                vTokens->nSize--;
            // load them into the new array
            for ( i = 0; i < vTokens->nSize; i++ )
                Vec_PtrPush( p->vNewTokens, Extra_UtilStrsav((char *)vTokens->pArray[i]) );
            continue;
        }
        // otherwise, load them and break
        for ( i = 0; i < vTokens->nSize; i++ )
            Vec_PtrPush( p->vNewTokens, Extra_UtilStrsav((char *)vTokens->pArray[i]) );
        break;
    }
    return p->vNewTokens;
}